

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::MpPackedFixed<true>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  uint64_t uVar1;
  ushort *ptr_00;
  uint32_t size;
  uint uVar2;
  FieldEntry *pFVar3;
  void *x;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 out;
  ushort *puVar4;
  string *psVar5;
  ulong uVar6;
  char *pcVar7;
  uint *puVar8;
  ParseContext *extraout_RDX;
  ParseContext *extraout_RDX_00;
  ParseContext *ctx_00;
  ushort uVar9;
  ushort *local_60;
  unsigned_short local_52;
  TcParseTableBase *local_50;
  uint64_t local_48;
  ushort local_40 [8];
  
  local_60 = (ushort *)ptr;
  pFVar3 = RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>
                     (table,(ulong)data.field_0 >> 0x20);
  if ((data.field_0._0_4_ & 7) != 2) {
    pcVar7 = MpRepeatedFixed<true>(msg,ptr,ctx,data,table,hasbits);
    return pcVar7;
  }
  uVar9 = pFVar3->type_card;
  local_50 = table;
  local_48 = hasbits;
  x = MaybeGetSplitBase(msg,true,table);
  size = ReadSize((char **)&local_60);
  uVar9 = uVar9 & 0x1c0;
  if (uVar9 == 0xc0) {
    out = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
          MaybeCreateRepeatedRefAt<google::protobuf::RepeatedField<unsigned_long>,true>
                    (x,(ulong)pFVar3->offset,msg);
    puVar4 = (ushort *)
             EpsCopyInputStream::ReadPackedFixed<unsigned_long>
                       (&ctx->super_EpsCopyInputStream,(char *)local_60,size,
                        (RepeatedField<unsigned_long> *)out);
    ctx_00 = extraout_RDX;
  }
  else {
    local_52 = 0x80;
    local_40[0] = uVar9;
    psVar5 = absl::lts_20240722::log_internal::Check_EQImpl<unsigned_short,unsigned_short>
                       (local_40,&local_52,"rep == static_cast<uint16_t>(field_layout::kRep32Bits)")
    ;
    if (psVar5 != (string *)0x0) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
                 ,0x728,psVar5->_M_string_length,(psVar5->_M_dataplus)._M_p);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)local_40);
    }
    out = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
          MaybeCreateRepeatedRefAt<google::protobuf::RepeatedField<unsigned_int>,true>
                    (x,(ulong)pFVar3->offset,msg);
    puVar4 = (ushort *)
             EpsCopyInputStream::ReadPackedFixed<unsigned_int>
                       (&ctx->super_EpsCopyInputStream,(char *)local_60,size,
                        (RepeatedField<unsigned_int> *)out);
    ctx_00 = extraout_RDX_00;
  }
  uVar1 = local_48;
  if (puVar4 == (ushort *)0x0) {
    ptr_00 = local_60;
    local_60 = puVar4;
    pcVar7 = Error(msg,(char *)ptr_00,ctx_00,(TcFieldData)out,local_50,local_48);
    return pcVar7;
  }
  if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar4) {
    if ((ulong)local_50->has_bits_offset != 0) {
      local_60 = puVar4;
      puVar8 = RefAt<unsigned_int>(msg,(ulong)local_50->has_bits_offset);
      *puVar8 = *puVar8 | (uint)uVar1;
    }
    return (char *)puVar4;
  }
  uVar2 = (uint)local_50->fast_idx_mask & (uint)*puVar4;
  if ((uVar2 & 7) == 0) {
    uVar6 = (ulong)(uVar2 & 0xfffffff8);
    local_60 = puVar4;
    pcVar7 = (char *)(**(code **)(&local_50[1].has_bits_offset + uVar6))
                               (msg,puVar4,ctx,
                                (ulong)*puVar4 ^ *(ulong *)(&local_50[1].fast_idx_mask + uVar6 * 2),
                                local_50,local_48);
    return pcVar7;
  }
  local_60 = puVar4;
  protobuf_assumption_failed
            ("(idx & 7) == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
             ,0x44d);
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpPackedFixed(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint16_t type_card = entry.type_card;
  const uint32_t decoded_wiretype = data.tag() & 7;

  // Check for non-packed repeated fallback:
  if (decoded_wiretype != WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
    PROTOBUF_MUSTTAIL return MpRepeatedFixed<is_split>(PROTOBUF_TC_PARAM_PASS);
  }

  void* const base = MaybeGetSplitBase(msg, is_split, table);
  int size = ReadSize(&ptr);
  uint16_t rep = type_card & field_layout::kRepMask;
  if (rep == field_layout::kRep64Bits) {
    auto& field = MaybeCreateRepeatedFieldRefAt<uint64_t, is_split>(
        base, entry.offset, msg);
    ptr = ctx->ReadPackedFixed(ptr, size, &field);
  } else {
    ABSL_DCHECK_EQ(rep, static_cast<uint16_t>(field_layout::kRep32Bits));
    auto& field = MaybeCreateRepeatedFieldRefAt<uint32_t, is_split>(
        base, entry.offset, msg);
    ptr = ctx->ReadPackedFixed(ptr, size, &field);
  }

  if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) {
    PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
  }
  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}